

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O3

void __thiscall
OpenMD::RNEMD::SPFForceManager::setDeltaLambda(SPFForceManager *this,RealType spfTarget)

{
  double dVar1;
  undefined8 uVar2;
  shared_ptr<OpenMD::SPFData> currentSPFData;
  Vector3d *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (this->hasSelectedMolecule_ == true) {
    Snapshot::getSPFData(this->currentSnapshot_);
    dVar1 = local_38[1].super_Vector<double,_3U>.data_[0];
    if ((1.0 <= dVar1) || (ABS(dVar1 + -1.0) < 1e-06)) {
      if (this->selectedMolecule_ != (Molecule *)0x0) {
        Molecule::setCom(this->selectedMolecule_,local_38);
        this->selectedMolecule_ = (Molecule *)0x0;
      }
      if (local_38 != (Vector3d *)OpenMD::V3Zero) {
        (local_38->super_Vector<double,_3U>).data_[2] = (double)OpenMD::V3Zero._16_8_;
        uVar2 = OpenMD::V3Zero._8_8_;
        (local_38->super_Vector<double,_3U>).data_[0] = (double)OpenMD::V3Zero._0_8_;
        (local_38->super_Vector<double,_3U>).data_[1] = (double)uVar2;
      }
      local_38[1].super_Vector<double,_3U>.data_[0] = 0.0;
      *(undefined4 *)(local_38[1].super_Vector<double,_3U>.data_ + 1) = 0xffffffff;
      this->deltaLambda_ = 0.0;
      std::vector<int,_std::allocator<int>_>::operator=
                (&(this->super_ForceManager).neighborList_,&this->sinkNeighborList_);
      std::vector<int,_std::allocator<int>_>::operator=
                (&(this->super_ForceManager).point_,&this->sinkPoint_);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
                (&(this->super_ForceManager).savedPositions_,&this->sinkSavedPositions_);
      this->hasSelectedMolecule_ = false;
      SPFMethod::selectMolecule(this->spfRNEMD_);
    }
    else {
      this->deltaLambda_ = ABS(spfTarget);
      if (1.0 <= ABS(spfTarget) + dVar1) {
        this->deltaLambda_ = 1.0 - dVar1;
      }
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
  }
  return;
}

Assistant:

void SPFForceManager::setDeltaLambda(RealType spfTarget) {
    if (hasSelectedMolecule_) {
      std::shared_ptr<SPFData> currentSPFData = currentSnapshot_->getSPFData();

      // Check to see if we are already fully in sink region
      if (currentSPFData->lambda >= 1.0 ||
          std::fabs(currentSPFData->lambda - 1.0) < 1e-6) {
        // Only the processor with the selected molecule should do this step:
        if (selectedMolecule_) {
          selectedMolecule_->setCom(currentSPFData->pos);
          selectedMolecule_ = nullptr;
        }

        currentSPFData->clear();
        deltaLambda_ = 0.0;

        neighborList_   = sinkNeighborList_;
        point_          = sinkPoint_;
        savedPositions_ = sinkSavedPositions_;

        hasSelectedMolecule_ = false;

        spfRNEMD_->selectMolecule();

        return;
      }

      // survived the return true, so lambda is not >= 1:
      // currentSPFTarget is an ion flux target, so can have sign:
      deltaLambda_ = std::fabs(spfTarget);

      if (currentSPFData->lambda + deltaLambda_ >= 1.0) {
        /*
         * New deltaLambda should be determined such that:
         *  f_lambda(lambda + deltaLambda) = 1
         */
        deltaLambda_ = 1.0 - currentSPFData->lambda;
      }
    }
  }